

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

size_t __thiscall
ikfast::IkSolutionList<double>::AddSolution
          (IkSolutionList<double> *this,
          vector<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
          *vinfos,vector<int,_std::allocator<int>_> *vfree)

{
  size_t sVar1;
  IkSolution<double> local_50;
  
  sVar1 = (this->_listsolutions).
          super__List_base<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
          ._M_impl._M_node._M_size;
  IkSolution<double>::IkSolution(&local_50,vinfos,vfree);
  std::__cxx11::list<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>::
  push_back(&this->_listsolutions,&local_50);
  IkSolution<double>::~IkSolution(&local_50);
  return sVar1;
}

Assistant:

virtual size_t AddSolution(const std::vector<IkSingleDOFSolutionBase<T> >& vinfos, const std::vector<int>& vfree)
    {
        size_t index = _listsolutions.size();
        _listsolutions.push_back(IkSolution<T>(vinfos,vfree));
        return index;
    }